

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_Subscription_deleteMembers(UA_Subscription *subscription,UA_Server *server)

{
  UA_MonitoredItem *pUVar1;
  UA_NotificationMessageEntry *pUVar2;
  UA_MonitoredItem *monitoredItem;
  UA_NotificationMessageEntry *pUVar3;
  UA_NotificationMessageEntry *__ptr;
  
  if (subscription->publishJobIsRegistered == true) {
    subscription->publishJobIsRegistered = false;
    UA_Server_removeRepeatedJob(server,subscription->publishJobGuid);
  }
  monitoredItem = (subscription->monitoredItems).lh_first;
  while (monitoredItem != (UA_MonitoredItem *)0x0) {
    pUVar1 = (monitoredItem->listEntry).le_next;
    if (pUVar1 != (UA_MonitoredItem *)0x0) {
      (pUVar1->listEntry).le_prev = (monitoredItem->listEntry).le_prev;
    }
    *(monitoredItem->listEntry).le_prev = pUVar1;
    MonitoredItem_delete(server,monitoredItem);
    monitoredItem = pUVar1;
  }
  __ptr = (subscription->retransmissionQueue).tqh_first;
  if (__ptr != (UA_NotificationMessageEntry *)0x0) {
    do {
      pUVar2 = (__ptr->listEntry).tqe_next;
      pUVar3 = pUVar2;
      if (pUVar2 == (UA_NotificationMessageEntry *)0x0) {
        pUVar3 = (UA_NotificationMessageEntry *)&subscription->retransmissionQueue;
      }
      (pUVar3->listEntry).tqe_prev = (__ptr->listEntry).tqe_prev;
      *(__ptr->listEntry).tqe_prev = pUVar2;
      deleteMembers_noInit(&__ptr->message,UA_TYPES + 0x22);
      (__ptr->message).notificationDataSize = 0;
      (__ptr->message).notificationData = (UA_ExtensionObject *)0x0;
      *(undefined8 *)&__ptr->message = 0;
      (__ptr->message).publishTime = 0;
      free(__ptr);
      __ptr = pUVar2;
    } while (pUVar2 != (UA_NotificationMessageEntry *)0x0);
  }
  subscription->retransmissionQueueSize = 0;
  return;
}

Assistant:

void UA_Subscription_deleteMembers(UA_Subscription *subscription, UA_Server *server) {
    Subscription_unregisterPublishJob(server, subscription);

    /* Delete monitored Items */
    UA_MonitoredItem *mon, *tmp_mon;
    LIST_FOREACH_SAFE(mon, &subscription->monitoredItems, listEntry, tmp_mon) {
        LIST_REMOVE(mon, listEntry);
        MonitoredItem_delete(server, mon);
    }

    /* Delete Retransmission Queue */
    UA_NotificationMessageEntry *nme, *nme_tmp;
    TAILQ_FOREACH_SAFE(nme, &subscription->retransmissionQueue, listEntry, nme_tmp) {
        TAILQ_REMOVE(&subscription->retransmissionQueue, nme, listEntry);
        UA_NotificationMessage_deleteMembers(&nme->message);
        UA_free(nme);
    }
    subscription->retransmissionQueueSize = 0;
}